

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compiler.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar3;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar4;
  basic_command_line_parser<char> *this;
  size_type sVar5;
  any *paVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  char **ppcVar8;
  int iVar9;
  allocator<char> local_251;
  string mode;
  allocator<char> local_228 [32];
  string local_208;
  string filepath;
  positional_options_description p;
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_128 [144];
  options_description desc;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vm,"Allowed options",(allocator<char> *)&filepath);
  boost::program_options::options_description::options_description
            (&desc,(string *)&vm,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)&vm);
  _vm = boost::program_options::options_description::add_options();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&vm,"help,h");
  ptVar3 = boost::program_options::value<std::__cxx11::string>();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"mode,m",(char *)ptVar3);
  ptVar4 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  boost::program_options::options_description_easy_init::operator()
            (pcVar2,(value_semantic *)"input-file",(char *)ptVar4);
  boost::program_options::positional_options_description::positional_options_description(&p);
  boost::program_options::positional_options_description::add((char *)&p,0x10d084);
  boost::program_options::variables_map::variables_map(&vm);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&filepath,argc,argv);
  this = boost::program_options::basic_command_line_parser<char>::options
                   ((basic_command_line_parser<char> *)&filepath,&desc);
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)this);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)&mode,this);
  boost::program_options::store((basic_parsed_options *)&mode,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&mode);
  boost::program_options::detail::cmdline::~cmdline((cmdline *)&filepath);
  boost::program_options::notify(&vm);
  std::__cxx11::string::string<std::allocator<char>>((string *)&filepath,"input-file",local_228);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_128,&filepath);
  if (sVar5 == 0) {
    std::__cxx11::string::~string((string *)&filepath);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&mode,"mode",&local_251);
    sVar5 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_128,&mode);
    std::__cxx11::string::~string((string *)&mode);
    std::__cxx11::string::~string((string *)&filepath);
    if (sVar5 != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&mode,"input-file",local_228);
      paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      pvVar7 = boost::
               any_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                         (paVar6);
      std::__cxx11::string::string
                ((string *)&filepath,
                 (pvVar7->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
      std::__cxx11::string::~string((string *)&mode);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_228,"mode",&local_251);
      paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
      __str = boost::any_cast<std::__cxx11::string_const&>(paVar6);
      std::__cxx11::string::string((string *)&mode,__str);
      std::__cxx11::string::~string((string *)local_228);
      ppcVar8 = std::
                __find_if<char_const**,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (tester::test_mode,&PTR_typeinfo_00115268,&mode);
      if (ppcVar8 != &PTR_typeinfo_00115268) {
        std::__cxx11::string::string((string *)&local_208,&filepath);
        bVar1 = lexer_tester::test_file(&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        if (bVar1) {
          print<char[5]>((char (*) [5])"PASS");
          std::__cxx11::string::~string((string *)&mode);
          std::__cxx11::string::~string((string *)&filepath);
          iVar9 = 0;
          goto LAB_0010593f;
        }
        print<char[5]>((char (*) [5])"FAIL");
      }
      std::__cxx11::string::~string((string *)&mode);
      std::__cxx11::string::~string((string *)&filepath);
      iVar9 = 1;
      goto LAB_0010593f;
    }
  }
  print<char[36]>((char (*) [36])"USAGE: ./tester <flags> <test file>");
  print<char[7]>((char (*) [7])"FLAGS:");
  print<char[33]>((char (*) [33])"\t-help/-h : display this message");
  iVar9 = 0;
  print<char[55]>((char (*) [55])"\t-mode/-m : [lexer/parser/semantics/codegen/optimizer]");
LAB_0010593f:
  boost::program_options::variables_map::~variables_map(&vm);
  boost::program_options::positional_options_description::~positional_options_description(&p);
  boost::program_options::options_description::~options_description(&desc);
  return iVar9;
}

Assistant:

int main(int argc, char *argv[]) {

    po::options_description desc("Allowed options");
    desc.add_options()
            ("help,h", "produce help message")
            ("mode,m", po::value<string>(), "mode")
            ("input-file", po::value< vector<string> >(), "input file")
            ;

    po::positional_options_description p;
    p.add("input-file", -1);

    po::variables_map vm;
    po::store(po::command_line_parser(argc, argv).
            options(desc).positional(p).run(), vm);
    po::notify(vm);

    if (vm.count("input-file") && vm.count("mode")) {
        string filepath = vm["input-file"].as< vector<string> >().front();
        string mode = vm["mode"].as<string>();

        if(!(exists_in_set(mode, test_mode))) {
            return 1;
        }

        // Handle file
        bool result = lexer_tester::test_file(filepath);

        if(result) {
            print("PASS");
        }
        else {
            print("FAIL");
            return 1;
        }
    }
    else {
        print("USAGE: ./tester <flags> <test file>");
        print("FLAGS:");
        print("\t-help/-h : display this message");
        print("\t-mode/-m : [lexer/parser/semantics/codegen/optimizer]");
    }

    return 0;

}